

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O1

Iterator * __thiscall
wasm::
SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
::Iterator::operator++(Iterator *this)

{
  vector<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
  *this_00;
  unordered_map<wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>_>
  *this_01;
  pointer __args;
  pointer *ppWVar1;
  HeapType *pHVar2;
  size_type sVar3;
  iterator __position;
  pointer pWVar4;
  pointer pHVar5;
  _Storage<wasm::HeapType,_true> _Var6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  __node_ptr __node;
  size_t __c;
  __node_ptr p_Var9;
  const_iterator cVar10;
  ulong uVar11;
  ulong uVar12;
  pointer pHVar13;
  __node_ptr p_Var14;
  size_type in_R8;
  pointer __ptr_1;
  __node_ptr p_Var15;
  SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  *pSVar16;
  HeapType local_c0;
  SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  *local_b8;
  optional<wasm::HeapType> *local_b0;
  anon_struct_8_0_00000001_for___align local_a8;
  vector<wasm::HeapType,std::allocator<wasm::HeapType>> *local_a0;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_98;
  key_type local_80;
  SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  *local_78;
  undefined1 local_70 [8];
  Iterator __begin0;
  
  _Var6 = (_Storage<wasm::HeapType,_true>)
          (_Storage<wasm::HeapType,_true>)
          __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id;
  local_70 = (undefined1  [8])(this->scc).parent;
  __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)
       ((ulong)__begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload & 0xffffffffffffff00);
  if ((local_70 != (undefined1  [8])0x0) &&
     ((((SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
         *)local_70)->currRoot).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged == true)) {
    __begin0.parent =
         (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
          *)(((SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
               *)local_70)->stack).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].id;
    __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._1_7_ = _Var6._1_7_;
    __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = 1;
  }
  if (local_70 != (undefined1  [8])0x0) {
    do {
      if (*(bool *)((long)local_70 + 0x90) == false) break;
      SCC::Iterator::operator++((Iterator *)local_70);
    } while (local_70 != (undefined1  [8])0x0);
  }
  pSVar16 = (this->scc).parent;
  this_00 = &pSVar16->workStack;
  this_01 = &pSVar16->elementInfo;
  local_a0 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&pSVar16->stack;
  local_b0 = &pSVar16->currParent;
  local_b8 = pSVar16 + 1;
  local_78 = pSVar16;
  do {
    pHVar2 = (pSVar16->inputIt)._M_current;
    if ((pHVar2 == (pSVar16->inputEnd)._M_current) &&
       ((pSVar16->workStack).
        super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pSVar16->workStack).
        super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      (this->scc).parent =
           (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
            *)0x0;
      return this;
    }
    if ((pSVar16->workStack).
        super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pSVar16->workStack).
        super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      (pSVar16->inputIt)._M_current = pHVar2 + 1;
      local_70 = (undefined1  [8])pHVar2->id;
      __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)
           ((ulong)__begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::HeapType>._M_payload & 0xffffffffffffff00);
      __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged = false;
      std::
      vector<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
      ::push_back(this_00,(value_type *)local_70);
    }
    while (pWVar4 = (pSVar16->workStack).
                    super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          (pSVar16->workStack).
          super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
          ._M_impl.super__Vector_impl_data._M_start != pWVar4) {
      __args = pWVar4 + -1;
      if (pWVar4[-1].processedChildren == false) {
        sVar3 = (pSVar16->elementInfo)._M_h._M_element_count;
        local_a8 = (anon_struct_8_0_00000001_for___align)(__args->item).id;
        __node = (__node_ptr)operator_new(0x30);
        (__node->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
        (__node->
        super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
        ).
        super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>
        ._M_storage._M_storage.__align = local_a8;
        *(size_type *)
         ((long)&(__node->
                 super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>
                 ._M_storage._M_storage + 8) = sVar3;
        *(size_type *)
         ((long)&(__node->
                 super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>
                 ._M_storage._M_storage + 0x10) = sVar3;
        (__node->
        super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
        ).
        super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>
        ._M_storage._M_storage.__data[0x18] = '\x01';
        __c = std::hash<wasm::HeapType>::operator()
                        ((hash<wasm::HeapType> *)this_01,
                         (HeapType *)
                         &__node->
                          super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
                        );
        uVar11 = __c % (pSVar16->elementInfo)._M_h._M_bucket_count;
        p_Var9 = std::
                 _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::_M_find_node(&this_01->_M_h,uVar11,
                                (key_type *)
                                &__node->
                                 super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
                                ,__c);
        p_Var14 = __node;
        p_Var15 = p_Var9;
        if (p_Var9 == (__node_ptr)0x0) {
          std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_insert_unique_node(&this_01->_M_h,uVar11,__c,__node,in_R8);
          p_Var14 = (__node_ptr)0x0;
          p_Var15 = __node;
        }
        if (p_Var14 != (__node_ptr)0x0) {
          operator_delete(p_Var14,0x30);
        }
        pSVar16 = local_78;
        if (p_Var9 == (__node_ptr)0x0) {
          __position._M_current =
               (local_78->stack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (local_78->stack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
            _M_realloc_insert<wasm::HeapType_const&>(local_a0,__position,&__args->item);
          }
          else {
            (__position._M_current)->id = (__args->item).id;
            (local_78->stack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          pWVar4[-1].processedChildren = true;
          (pSVar16->currParent).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload =
               (_Storage<wasm::HeapType,_true>)pWVar4[-1].item.id;
          if ((pSVar16->currParent).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_engaged == false) {
            (pSVar16->currParent).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_engaged = true;
          }
          local_c0.id = (__args->item).id;
          HeapType::getReferencedHeapTypes(&local_98,&local_c0);
          pHVar5 = local_98.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pHVar13 = local_98.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_start; pHVar13 != pHVar5; pHVar13 = pHVar13 + 1
              ) {
            local_80.id = pHVar13->id;
            cVar10 = std::
                     _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_b8,&local_80);
            if (cVar10.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0)
            {
              if ((pSVar16->currParent).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_engaged == false) {
                __assert_fail("currParent",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/strongly_connected_components.h"
                              ,0xa9,
                              "void wasm::SCCs<__gnu_cxx::__normal_iterator<const wasm::HeapType *, std::vector<wasm::HeapType>>, wasm::(anonymous namespace)::TypeSCCs>::push(const T &) [It = __gnu_cxx::__normal_iterator<const wasm::HeapType *, std::vector<wasm::HeapType>>, Class = wasm::(anonymous namespace)::TypeSCCs]"
                             );
              }
              local_70 = (undefined1  [8])local_80.id;
              __begin0.parent =
                   *(SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                     **)&(local_b0->super__Optional_base<wasm::HeapType,_true,_true>)._M_payload.
                         super__Optional_payload_base<wasm::HeapType>._M_payload;
              __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_payload =
                   *(_Storage<wasm::HeapType,_true> *)
                    &(local_b0->super__Optional_base<wasm::HeapType,_true,_true>)._M_payload.
                     super__Optional_payload_base<wasm::HeapType>._M_engaged;
              __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_engaged = false;
              std::
              vector<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
              ::push_back(this_00,(value_type *)local_70);
            }
          }
          if (local_98.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_98.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((pSVar16->currParent).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_engaged == true) {
            (pSVar16->currParent).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_engaged = false;
          }
        }
        else {
          if ((p_Var15->
              super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
              ).
              super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>
              ._M_storage._M_storage.__data[0x18] == '\x01') {
            if (pWVar4[-1].parent.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_engaged == false) {
              __assert_fail("work.parent",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/strongly_connected_components.h"
                            ,0x6e,
                            "bool wasm::SCCs<__gnu_cxx::__normal_iterator<const wasm::HeapType *, std::vector<wasm::HeapType>>, wasm::(anonymous namespace)::TypeSCCs>::stepToNextGroup() [It = __gnu_cxx::__normal_iterator<const wasm::HeapType *, std::vector<wasm::HeapType>>, Class = wasm::(anonymous namespace)::TypeSCCs]"
                           );
            }
            pmVar7 = std::
                     unordered_map<wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>_>
                     ::operator[](this_01,(key_type *)&pWVar4[-1].parent);
            uVar11 = *(ulong *)((long)&(p_Var15->
                                       super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>
                                       ._M_storage._M_storage + 8);
            uVar12 = pmVar7->lowlink;
            if (uVar11 < pmVar7->lowlink) {
              uVar12 = uVar11;
            }
            pmVar7->lowlink = uVar12;
          }
          ppWVar1 = &(local_78->workStack).
                     super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppWVar1 = *ppWVar1 + -1;
          pSVar16 = local_78;
        }
      }
      else {
        pmVar7 = std::
                 unordered_map<wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>_>
                 ::operator[](this_01,&__args->item);
        if (pWVar4[-1].parent.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_engaged == true) {
          pmVar8 = std::
                   unordered_map<wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>_>
                   ::operator[](this_01,(key_type *)&pWVar4[-1].parent);
          uVar11 = pmVar8->lowlink;
          if (pmVar7->lowlink < pmVar8->lowlink) {
            uVar11 = pmVar7->lowlink;
          }
          pmVar8->lowlink = uVar11;
        }
        if (pmVar7->index == pmVar7->lowlink) {
          (pSVar16->currRoot).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload =
               (_Storage<wasm::HeapType,_true>)(__args->item).id;
          if ((pSVar16->currRoot).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_engaged == false) {
            (pSVar16->currRoot).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_engaged = true;
          }
          ppWVar1 = &(pSVar16->workStack).
                     super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppWVar1 = *ppWVar1 + -1;
          return this;
        }
        ppWVar1 = &(pSVar16->workStack).
                   super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppWVar1 = *ppWVar1 + -1;
      }
    }
  } while( true );
}

Assistant:

Iterator& operator++() {
      // Skip the rest of the current SCC, if for some reason it was not
      // consumed.
      for (auto elem : *(*this)) {
        (void)elem;
      }
      if (!scc.parent->stepToNextGroup()) {
        // We are at the end, so mark ourselves as such.
        scc.parent = nullptr;
      }
      return *this;
    }